

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void francisQR(double *A,int N)

{
  ulong uVar1;
  int i_3;
  int iVar2;
  uint uVar3;
  int iVar4;
  double *x;
  double *v;
  double *A_00;
  double *C;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int N_1;
  uint m;
  uint uVar8;
  double *pdVar9;
  int i;
  uint uVar10;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double *local_88;
  int N_2;
  
  uVar22 = (ulong)(uint)N;
  x = (double *)malloc(0x18);
  v = (double *)malloc(0x18);
  lVar23 = (long)N;
  A_00 = (double *)malloc(lVar23 * 0x18);
  C = (double *)malloc(lVar23 * 8);
  uVar10 = N * N;
  dVar26 = A[(ulong)uVar10 - 1] + A[(long)(int)(uVar10 - N) + -2];
  dVar24 = *A;
  dVar25 = A[lVar23];
  *x = ((dVar24 * dVar24 + A[1] * dVar25) - dVar26 * dVar24) +
       (A[(ulong)uVar10 - 1] * A[(long)(int)(uVar10 - N) + -2] -
       A[(long)(int)(uVar10 - N) + -1] * A[(ulong)uVar10 - 2]);
  x[1] = ((dVar24 + A[lVar23 + 1]) - dVar26) * dVar25;
  x[2] = dVar25 * A[N * 2 + 1];
  if (N < 3) {
    return;
  }
  uVar10 = N - 1;
  uVar5 = (ulong)(N - 2U);
  uVar8 = 3;
  uVar21 = 0;
  uVar7 = 0xffffffffffffffff;
  pdVar12 = A;
  local_88 = A;
  do {
    iVar17 = (int)uVar7;
    uVar6 = 0;
    if (0 < iVar17) {
      uVar6 = uVar7 & 0xffffffff;
    }
    iVar2 = (int)uVar6;
    uVar3 = uVar10;
    if ((int)uVar8 < (int)uVar10) {
      uVar3 = uVar8;
    }
    dVar24 = house(x,3,v);
    uVar13 = uVar7 + 4;
    lVar15 = 0;
    uVar18 = uVar6;
    uVar1 = uVar7;
    uVar11 = uVar21;
    pdVar9 = pdVar12;
    lVar16 = lVar15;
    do {
      while ((long)uVar1 < lVar23) {
        *(double *)((long)A_00 + (lVar15 >> 0x1d)) = pdVar9[uVar18];
        lVar15 = lVar15 + 0x300000000;
        uVar18 = uVar18 + 1;
        uVar1 = uVar18;
      }
      uVar11 = uVar11 + 1;
      pdVar9 = pdVar9 + lVar23;
      lVar15 = lVar16 + 0x100000000;
      uVar18 = uVar6;
      uVar1 = uVar7;
      lVar16 = lVar15;
    } while (uVar11 < uVar13);
    mmult(A_00,v,C,N - iVar2,3,1);
    if (N - iVar2 != 0 && iVar2 <= N) {
      uVar18 = 0;
      do {
        C[uVar18] = C[uVar18] * dVar24;
        uVar18 = uVar18 + 1;
      } while ((uint)(N - iVar2) != uVar18);
    }
    mmult(v,C,A_00,3,1,N - iVar2);
    iVar14 = 0;
    uVar18 = uVar6;
    uVar11 = uVar21;
    pdVar9 = pdVar12;
    iVar4 = iVar14;
    do {
      while ((long)uVar1 < lVar23) {
        pdVar9[uVar18] = pdVar9[uVar18] - A_00[iVar14];
        iVar14 = iVar14 + 1;
        uVar18 = uVar18 + 1;
        uVar1 = uVar18;
      }
      uVar11 = uVar11 + 1;
      pdVar9 = pdVar9 + lVar23;
      iVar14 = iVar4 + (N - iVar2);
      uVar18 = uVar6;
      uVar1 = uVar7;
      iVar4 = iVar14;
    } while (uVar11 < uVar13);
    m = iVar17 + 5;
    if ((long)(ulong)uVar10 <= (long)uVar13) {
      m = N;
    }
    if ((int)m < 1) {
      mmult(A_00,v,C,m,3,1);
LAB_0011ff8f:
      mmult(C,v,A_00,m,1,3);
    }
    else {
      lVar15 = 0;
      uVar6 = 0;
      pdVar9 = local_88;
      do {
        lVar19 = 0;
        lVar16 = lVar15;
        do {
          *(double *)((long)A_00 + (lVar16 >> 0x1d)) = pdVar9[lVar19];
          lVar16 = lVar16 + 0x100000000;
          lVar20 = lVar19 + uVar21;
          lVar19 = lVar19 + 1;
        } while (lVar20 + 1U < uVar13);
        uVar6 = uVar6 + 1;
        pdVar9 = pdVar9 + lVar23;
        lVar15 = lVar15 + 0x300000000;
      } while (uVar6 != uVar3 + 1);
      mmult(A_00,v,C,m,3,1);
      if ((int)m < 1) goto LAB_0011ff8f;
      uVar6 = 0;
      do {
        C[uVar6] = C[uVar6] * dVar24;
        uVar6 = uVar6 + 1;
      } while (m != uVar6);
      mmult(C,v,A_00,m,1,3);
      if (0 < (int)m) {
        lVar15 = 0;
        uVar6 = 0;
        pdVar9 = local_88;
        do {
          lVar19 = 0;
          lVar16 = lVar15;
          do {
            pdVar9[lVar19] = pdVar9[lVar19] - *(double *)((long)A_00 + (lVar16 >> 0x1d));
            lVar16 = lVar16 + 0x100000000;
            lVar20 = lVar19 + uVar21;
            lVar19 = lVar19 + 1;
          } while (lVar20 + 1U < uVar13);
          uVar6 = uVar6 + 1;
          pdVar9 = pdVar9 + lVar23;
          lVar15 = lVar15 + 0x300000000;
        } while (uVar6 != uVar3 + 1);
      }
    }
    *x = A[uVar7 + (long)((iVar17 + 2) * N) + 1];
    x[1] = A[uVar7 + (long)((iVar17 + 3) * N) + 1];
    if ((long)uVar7 < (long)(N + -4)) {
      x[2] = A[uVar13 * lVar23 + uVar7 + 1];
    }
    uVar21 = uVar21 + 1;
    uVar8 = uVar8 + 1;
    pdVar12 = pdVar12 + lVar23;
    local_88 = local_88 + 1;
    uVar7 = uVar7 + 1;
    if (uVar21 == uVar5) {
      dVar24 = house(x,2,v);
      lVar16 = (long)(N + -3);
      lVar19 = (long)(int)(N - 2U);
      pdVar12 = A + lVar23 * lVar19;
      iVar17 = -1;
      lVar15 = lVar19;
      do {
        pdVar9 = A_00 + (long)iVar17 + 1;
        lVar20 = lVar16;
        do {
          *pdVar9 = pdVar12[lVar20];
          lVar20 = lVar20 + 1;
          pdVar9 = pdVar9 + 2;
        } while (lVar20 < lVar23);
        lVar15 = lVar15 + 1;
        pdVar12 = pdVar12 + lVar23;
        iVar17 = iVar17 + 1;
      } while (lVar15 < lVar23);
      lVar15 = 0;
      pdVar12 = A_00;
      do {
        dVar25 = 0.0;
        lVar20 = 0;
        do {
          dVar25 = dVar25 + pdVar12[lVar20] * v[lVar20];
          lVar20 = lVar20 + 1;
        } while (lVar20 != 2);
        C[lVar15] = dVar25;
        lVar15 = lVar15 + 1;
        pdVar12 = pdVar12 + 2;
      } while (lVar15 != 3);
      lVar15 = 0;
      do {
        C[lVar15] = C[lVar15] * dVar24;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      lVar15 = 0;
      pdVar12 = A_00;
      do {
        dVar25 = v[lVar15];
        lVar20 = 0;
        do {
          pdVar12[lVar20] = C[lVar20] * dVar25 + 0.0;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 3);
        lVar15 = lVar15 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar15 != 2);
      pdVar12 = A + lVar23 * lVar19;
      iVar17 = -2;
      lVar15 = lVar16;
      lVar20 = lVar19;
      iVar2 = iVar17;
      do {
        do {
          pdVar12[lVar15] = pdVar12[lVar15] - A_00[(long)iVar17 + 2];
          lVar15 = lVar15 + 1;
          iVar17 = iVar17 + 1;
        } while (lVar15 < lVar23);
        lVar20 = lVar20 + 1;
        pdVar12 = pdVar12 + lVar23;
        iVar17 = iVar2 + 3;
        lVar15 = lVar16;
        iVar2 = iVar17;
      } while (lVar20 < lVar23);
      if ((int)uVar10 < N) {
        uVar10 = N;
      }
      lVar15 = 0;
      do {
        memcpy((void *)((long)A_00 + lVar15),A + (int)uVar5,(ulong)((uVar10 - N) + 1) * 8 + 8);
        uVar5 = (ulong)(uint)((int)uVar5 + N);
        lVar15 = lVar15 + 0x10;
      } while (uVar22 << 4 != lVar15);
      mmult(A_00,v,C,N,2,1);
      uVar7 = 0;
      do {
        C[uVar7] = C[uVar7] * dVar24;
        uVar7 = uVar7 + 1;
      } while (uVar22 != uVar7);
      mmult(C,v,A_00,N,1,2);
      iVar17 = -1;
      uVar7 = 0;
      lVar15 = lVar19;
      iVar2 = iVar17;
      do {
        do {
          A[lVar15] = A[lVar15] - A_00[(long)iVar17 + 1];
          lVar15 = lVar15 + 1;
          iVar17 = iVar17 + 1;
        } while (lVar15 < lVar23);
        uVar7 = uVar7 + 1;
        A = A + lVar23;
        iVar17 = iVar2 + 2;
        lVar15 = lVar19;
        iVar2 = iVar17;
      } while (uVar7 != uVar22);
      free(x);
      free(v);
      free(A_00);
      free(C);
      return;
    }
  } while( true );
}

Assistant:

void francisQR(double *A,int N) {
	int m,n,k,q,r,t,u,i,j;
	double s,t2,beta;
	double *x,*v,*AT,*w;
	int NN;
	/*
	 * Reference - Algorithm 7.5.1 Golub,van Loan Matrix Computations 3rd Edition
	 */ 
	x = (double*) malloc(sizeof(double) * 3);
	v = (double*) malloc(sizeof(double) * 3);
	AT = (double*) malloc(sizeof(double) * 3 * N);
	w = (double*) malloc(sizeof(double) * N);
	n = N-1;
	m = n-1;
	NN = N*N;
	
	s = A[NN-1] + A[NN-N-2];
	t2 = A[NN-1] * A[NN-N-2] - A[NN-2] * A[NN-N-1];
	
	x[0] = A[0]*A[0] + A[1]*A[N] - s*A[0] + t2;
	x[1] = A[N]*(A[0] + A[N+1] - s);
	x[2] = A[N] * A[N+N+1];
	if (N <= 2) {
		return;
	}
	
	for (k = -1; k < N - 3;++k) {
		
		beta = house(x,3,v);
		//mdisplay(x,3,1);
		if (k > 0) {
			q = k;
		} else {
			q = 0;
		}
		
		//printf("q %d \n",q);
		for (i=k+1; i < k+4; i++) {
			t = i * N;
			u = 0;
			for (j=q; j < N; j++) {
				AT[u+i-k-1] = A[j+t];
				u+=3;		
			}
		}
		
		mmult(AT,v,w,N-q,3,1);
		scale(w,N-q,1,beta);
		mmult(v,w,AT,3,1,N-q);
		
		for (i=k+1; i < k+4; i++) {
			t = i * N;
			for (j=q; j < N; j++) {
				A[t+j] -= AT[(i-k-1)*(N-q) + j - q];
			}
		}
		//mdisplay(A,N,N);
		if (k+4 >= n) {
			r = N;
		} else {
			r = k+4+1;
		}
		//printf("r %d \n",r);
		for (i=0; i < r; i++) {
			t = i * N;
			u = i * 3;
			for (j=k+1; j < k+4; j++) {
				AT[u+j-k-1] = A[t+j];
			}
		}
		
		mmult(AT,v,w,r,3,1);
		scale(w,r,1,beta);
		mmult(w,v,AT,r,1,3);
		//mdisplay(AT,N,N-k-1);
		
		for (i=0; i < r; i++) {
			t = i * N;
			u = i * 3;
			for (j=k+1; j < k+4; j++) {
				A[t+j] -= AT[u+j-k-1];
			}
		}
		//mdisplay(A,N,N);
		x[0] = A[N*(k+2) + k+1];
		x[1] = A[N*(k+3) + k+1];
		
		if (k < n-3) {
			x[2] = A[N*(k+4) + k+1];
		} 
		//mdisplay(x,3,1);
		
	}
	//mdisplay(x,2,1);
	beta = house(x,2,v);
	
	for (i=n-1; i < N; i++) {
		t = i * N;
		u = 0;
		for (j=n-2; j < N; j++) {
			AT[u+i-n+1] = A[j+t];
			u+=2;		
		}
	}
	
	mmult(AT,v,w,3,2,1);
	scale(w,3,1,beta);
	mmult(v,w,AT,2,1,3);
	for (i=n-1; i < N; i++) {
		t = i * N;
		for (j=n-2; j < N; j++) {
			A[t+j] -= AT[(i-n+1)*3 + j - n + 2];
		}
	}
	
	for (i=0; i < N; i++) {
		t = i * N;
		u = i * 2;
		for (j=n-1; j < N; j++) {
			AT[u+j-n+1] = A[t+j];
		}
	}
	
	mmult(AT,v,w,N,2,1);
	scale(w,N,1,beta);
	mmult(w,v,AT,N,1,2);
		//mdisplay(AT,N,N-k-1);
		
	for (i=0; i < N; i++) {
		t = i * N;
		u = i * 2;
		for (j=n-1; j < N; j++) {
			A[t+j] -= AT[u+j-n+1];
		}
	}
	
	
	free(x);
	free(v);
	free(AT);
	free(w);
	
}